

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_printer.h
# Opt level: O1

void Fantasy_Character_print_json_union_type(flatcc_json_printer_t *ctx,flatbuffers_utype_t type)

{
  int iVar1;
  undefined7 in_register_00000031;
  char *symbol;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 2:
    symbol = "MuLan";
    break;
  case 8:
    flatcc_json_printer_enum(ctx,"Rapunzel",8);
    return;
  case 9:
    symbol = "Belle";
    break;
  case 10:
    flatcc_json_printer_enum(ctx,"BookFan",7);
    return;
  case 0xb:
    symbol = "Other";
    break;
  default:
    if (iVar1 == 0xff) {
      flatcc_json_printer_enum(ctx,"Unused",6);
      return;
    }
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    flatcc_json_printer_enum(ctx,"NONE",4);
    return;
  }
  flatcc_json_printer_enum(ctx,symbol,5);
  return;
}

Assistant:

static void Fantasy_Character_print_json_union_type(flatcc_json_printer_t *ctx, flatbuffers_utype_t type)
{
    switch (type) {
    case 2:
        flatcc_json_printer_enum(ctx, "MuLan", 5);
        break;
    case 8:
        flatcc_json_printer_enum(ctx, "Rapunzel", 8);
        break;
    case 9:
        flatcc_json_printer_enum(ctx, "Belle", 5);
        break;
    case 10:
        flatcc_json_printer_enum(ctx, "BookFan", 7);
        break;
    case 11:
        flatcc_json_printer_enum(ctx, "Other", 5);
        break;
    case 255:
        flatcc_json_printer_enum(ctx, "Unused", 6);
        break;
    default:
        flatcc_json_printer_enum(ctx, "NONE", 4);
        break;
    }
}